

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

void anon_unknown.dwarf_ae8::ndiBXHelper(ndicapi *api,char *command,char *commandReply)

{
  char cVar1;
  byte bVar2;
  int j;
  long lVar3;
  float *pfVar4;
  ulong uVar5;
  uint uVar6;
  char (*pacVar7) [3];
  unsigned_long uVar8;
  float *pfVar9;
  char *pcVar10;
  ulong uVar11;
  float *pfVar12;
  float fVar13;
  
  uVar8 = 1;
  if (command[2] == ' ') {
    cVar1 = command[3];
  }
  else {
    if (command[2] != ':') goto LAB_00107fc4;
    cVar1 = command[7];
  }
  if (cVar1 != '\r') {
    uVar8 = ndiHexToUnsignedLong(command + 3,4);
  }
LAB_00107fc4:
  if ((*commandReply == -0x3c) && (commandReply[1] == -0x5b)) {
    api->BxReplyLength = *(unsigned_short *)(commandReply + 2);
    bVar2 = commandReply[6];
    pfVar12 = (float *)(commandReply + 7);
    api->BxHandleCount = bVar2;
    if ((ulong)bVar2 != 0) {
      pacVar7 = api->Bx3DMarkerOutOfVolume;
      pcVar10 = api->BxToolMarkerInformation[0] + 1;
      pfVar9 = api->Bx3DMarkerPosition[0][0] + 2;
      uVar11 = 0;
      pfVar4 = pfVar12;
      do {
        api->BxHandles[uVar11] = *(char *)pfVar4;
        cVar1 = *(char *)((long)pfVar4 + 1);
        api->BxHandlesStatus[uVar11] = cVar1;
        pfVar12 = (float *)((long)pfVar4 + 2);
        if (cVar1 != '\x04') {
          if ((uVar8 & 1) != 0) {
            if (cVar1 != '\x02') {
              api->BxTransforms[uVar11][0] = *(float *)((long)pfVar4 + 2);
              api->BxTransforms[uVar11][1] = *(float *)((long)pfVar4 + 6);
              api->BxTransforms[uVar11][2] = *(float *)((long)pfVar4 + 10);
              api->BxTransforms[uVar11][3] = *(float *)((long)pfVar4 + 0xe);
              api->BxTransforms[uVar11][4] = *(float *)((long)pfVar4 + 0x12);
              api->BxTransforms[uVar11][5] = *(float *)((long)pfVar4 + 0x16);
              api->BxTransforms[uVar11][6] = *(float *)((long)pfVar4 + 0x1a);
              api->BxTransforms[uVar11][7] = *(float *)((long)pfVar4 + 0x1e);
              pfVar12 = (float *)((long)pfVar4 + 0x22);
            }
            api->BxPortStatus[uVar11] =
                 (uint)*(byte *)((long)pfVar12 + 3) << 0x18 |
                 (int)*(char *)((long)pfVar12 + 2) << 0x10 |
                 (int)*(char *)((long)pfVar12 + 1) << 8 | (int)*(char *)pfVar12;
            api->BxFrameNumber[uVar11] = (uint)pfVar12[1];
            pfVar12 = pfVar12 + 2;
          }
          if ((uVar8 & 2) != 0) {
            api->BxToolMarkerInformation[uVar11][0] = *(char *)pfVar12;
            lVar3 = 0;
            do {
              pcVar10[lVar3] = *(char *)((long)pfVar12 + lVar3 + 1);
              lVar3 = lVar3 + 1;
            } while (lVar3 != 10);
            pfVar12 = (float *)((long)pfVar12 + 0xb);
          }
          if ((uVar8 & 4) != 0) {
            cVar1 = *(char *)pfVar12;
            api->BxActiveSingleStrayMarkerStatus[uVar11] = cVar1;
            if (cVar1 == '\0') {
              pfVar12 = (float *)((long)pfVar12 + 1);
            }
            else {
              api->BxActiveSingleStrayMarkerPosition[uVar11][0] = *(float *)((long)pfVar12 + 1);
              api->BxActiveSingleStrayMarkerPosition[uVar11][1] = *(float *)((long)pfVar12 + 5);
              api->BxActiveSingleStrayMarkerPosition[uVar11][2] = *(float *)((long)pfVar12 + 9);
              pfVar12 = (float *)((long)pfVar12 + 0xd);
            }
          }
          if ((uVar8 & 8) != 0) {
            cVar1 = *(char *)pfVar12;
            api->Bx3DMarkerCount[uVar11] = cVar1;
            fVar13 = ceilf((float)(int)cVar1 * 0.125);
            pfVar12 = (float *)((long)pfVar12 + 1);
            if (0 < (int)fVar13) {
              uVar5 = 0;
              do {
                (*pacVar7)[uVar5] = *(char *)((long)pfVar12 + uVar5);
                uVar5 = uVar5 + 1;
              } while ((uint)(int)fVar13 != uVar5);
              pfVar12 = (float *)((long)pfVar12 + uVar5);
            }
            if ('\0' < api->Bx3DMarkerCount[uVar11]) {
              lVar3 = 0;
              pfVar4 = pfVar9;
              do {
                (*(float (*) [3])(pfVar4 + -2))[0] = *pfVar12;
                pfVar4[-1] = pfVar12[1];
                *pfVar4 = pfVar12[2];
                pfVar12 = pfVar12 + 3;
                lVar3 = lVar3 + 1;
                pfVar4 = pfVar4 + 3;
              } while (lVar3 < api->Bx3DMarkerCount[uVar11]);
            }
          }
        }
        uVar11 = uVar11 + 1;
        pcVar10 = pcVar10 + 0xb;
        pacVar7 = pacVar7 + 1;
        pfVar9 = pfVar9 + 0x3c;
        pfVar4 = pfVar12;
      } while (uVar11 != bVar2);
    }
    if (((uint)uVar8 >> 0xc & 1) != 0) {
      cVar1 = *(char *)pfVar12;
      uVar6 = (uint)cVar1;
      api->BxPassiveStrayCount = uVar6;
      fVar13 = ceilf((float)(int)uVar6 * 0.125);
      pfVar12 = (float *)((long)pfVar12 + 1);
      if (0 < (int)fVar13) {
        uVar11 = 0;
        do {
          api->BxPassiveStrayOutOfVolume[uVar11] = *(char *)((long)pfVar12 + uVar11);
          uVar11 = uVar11 + 1;
        } while ((uint)(int)fVar13 != uVar11);
        pfVar12 = (float *)((long)pfVar12 + uVar11);
      }
      if ('\0' < cVar1) {
        lVar3 = 0;
        do {
          *(undefined4 *)((long)api->BxPassiveStrayPosition[0] + lVar3) =
               *(undefined4 *)((long)pfVar12 + lVar3);
          *(undefined4 *)((long)api->BxPassiveStrayPosition[0] + lVar3 + 4) =
               *(undefined4 *)((long)pfVar12 + lVar3 + 4);
          *(undefined4 *)((long)api->BxPassiveStrayPosition[0] + lVar3 + 8) =
               *(undefined4 *)((long)pfVar12 + lVar3 + 8);
          lVar3 = lVar3 + 0xc;
        } while ((ulong)uVar6 * 0xc != lVar3);
        pfVar12 = (float *)((long)pfVar12 + lVar3);
      }
    }
    api->BxSystemStatus = (int)*(char *)pfVar12 | (int)*(char *)((long)pfVar12 + 1) << 8;
  }
  return;
}

Assistant:

void ndiBXHelper(ndicapi* api, const char* command, const char* commandReply)
  {
    // Reply options
    // NDI_XFORMS_AND_STATUS  0x0001  /* transforms and status */
    // NDI_ADDITIONAL_INFO    0x0002  /* additional tool transform info */
    // NDI_SINGLE_STRAY       0x0004  /* stray active marker reporting */
    // NDI_FRAME_NUMBER       0x0008  /* frame number for each tool */
    // NDI_PASSIVE            0x8000  /* report passive tool information */
    // NDI_PASSIVE_EXTRA      0x2000  /* add 6 extra passive tools */
    // NDI_PASSIVE_STRAY      0x1000  /* stray passive marker reporting */
    unsigned long mode = NDI_XFORMS_AND_STATUS;
    const char* replyIndex;
    unsigned short headerCRC;

    // if the BX command had a reply option, read it
    if ((command[2] == ':' && command[7] != '\r') || (command[2] == ' ' && command[3] != '\r'))
    {
      mode = ndiHexToUnsignedLong(&command[3], 4);
    }

    replyIndex = &commandReply[0];

    // Confirm start sequence
    if (replyIndex[0] != (char)0xc4 || replyIndex[1] != (char)0xa5)  // little endian
    {
      // Something isn't right, abort
      return;
    }
    replyIndex += 2;

    // Get the reply length
    api->BxReplyLength = (unsigned char)replyIndex[1] << 8 | (unsigned char)replyIndex[0];
    replyIndex += 2;

    // Get the CRC
    headerCRC = (unsigned char)replyIndex[1] << 8 | (unsigned char)replyIndex[0];
    replyIndex += 2;

    // Get the number of handles
    api->BxHandleCount = (unsigned char)replyIndex[0];
    replyIndex += 1;

    // Go through the information for each handle
    for (unsigned short i = 0; i < api->BxHandleCount; i++)
    {
      // get the handle itself
      api->BxHandles[i] = (char)replyIndex[0];
      replyIndex++;

      api->BxHandlesStatus[i] = (char)replyIndex[0];
      replyIndex++;

      // Disabled handles have no reply data
      if (api->BxHandlesStatus[i] == NDI_HANDLE_DISABLED)
      {
        continue;
      }

      if (mode & NDI_XFORMS_AND_STATUS)
      {
        if (api->BxHandlesStatus[i] != NDI_HANDLE_MISSING)
        {
          // 4 float, Q0, Qx, Qy, Qz
          api->BxTransforms[i][0] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxTransforms[i][1] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxTransforms[i][2] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxTransforms[i][3] = *(float*)replyIndex;
          replyIndex += 4;

          // 3 float, Tx, Ty, Tz
          api->BxTransforms[i][4] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxTransforms[i][5] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxTransforms[i][6] = *(float*)replyIndex;
          replyIndex += 4;

          // 1 float, RMS error
          api->BxTransforms[i][7] = *(float*)replyIndex;
          replyIndex += 4;
        }
        // 4 bytes port status
        api->BxPortStatus[i] = (int)replyIndex[0] | (int)replyIndex[1] << 8 | (int)replyIndex[2] << 16 | (int)replyIndex[3] << 24;
        replyIndex += 4;
        // 4 bytes frame number
        api->BxFrameNumber[i] = (unsigned char)replyIndex[0] | (unsigned char)replyIndex[1] << 8 | (unsigned char)replyIndex[2] << 16 | (unsigned char)replyIndex[3] << 24;
        replyIndex += 4;
      }

      // grab additional information
      if (mode & NDI_ADDITIONAL_INFO)
      {
        api->BxToolMarkerInformation[i][0] = (char)replyIndex[0];
        replyIndex++;
        for (int j = 0; j < 10; j++)
        {
          api->BxToolMarkerInformation[i][j + 1] = (char)replyIndex[0];
          replyIndex++;
        }
      }

      // grab the single marker info
      if (mode & NDI_SINGLE_STRAY)
      {
        char activeStatus = (char)replyIndex[0];
        replyIndex++;
        api->BxActiveSingleStrayMarkerStatus[i] = activeStatus;

        if (activeStatus != 0x00 || (mode & NDI_NOT_NORMALLY_REPORTED && activeStatus & NDI_ACTIVE_STRAY_OUT_OF_VOLUME))
        {
          // Marker is not missing, or it is out-of-volume and not-normally-requested is requested
          // Either means we have data...
          // 3 float, Tx, Ty, Tz
          api->BxActiveSingleStrayMarkerPosition[i][0] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxActiveSingleStrayMarkerPosition[i][1] = *(float*)replyIndex;
          replyIndex += 4;
          api->BxActiveSingleStrayMarkerPosition[i][2] = *(float*)replyIndex;
          replyIndex += 4;
        }
      }

      if (mode & NDI_3D_MARKER_POSITIONS)
      {
        // Save marker count
        api->Bx3DMarkerCount[i] = (char)replyIndex[0];
        replyIndex++;

        // Save off out of volume status
        int numBytes = static_cast<int>(ceilf(api->Bx3DMarkerCount[i] / 8.f));
        for (int j = 0; j < numBytes; ++j)
        {
          api->Bx3DMarkerOutOfVolume[i][j] = (char)replyIndex[0];
          ++replyIndex;
        }

        for (int j = 0; j < api->Bx3DMarkerCount[i]; ++j)
        {
          // 3 float, Tx, Ty, Tz
          api->Bx3DMarkerPosition[i][j][0] = *(float*)replyIndex;
          replyIndex += 4;
          api->Bx3DMarkerPosition[i][j][1] = *(float*)replyIndex;
          replyIndex += 4;
          api->Bx3DMarkerPosition[i][j][2] = *(float*)replyIndex;
          replyIndex += 4;
        }
      }
    }

    if (mode & NDI_PASSIVE_STRAY)
    {
      // Save marker count
      api->BxPassiveStrayCount = (char)replyIndex[0];
      replyIndex++;

      if (api->BxPassiveStrayCount > 240)
      {
        // This implementation cannot report on more than 240 stray passive markers
        api->BxPassiveStrayCount = 240;
      }

      // Save off out of volume status
      int numBytes = static_cast<int>(ceilf(api->BxPassiveStrayCount / 8.f));
      for (int j = 0; j < numBytes; ++j)
      {
        api->BxPassiveStrayOutOfVolume[j] = (char)replyIndex[0];
        ++replyIndex;
      }

      for (int j = 0; j < api->BxPassiveStrayCount; ++j)
      {
        // 3 float, Tx, Ty, Tz
        api->BxPassiveStrayPosition[j][0] = *(float*)replyIndex;
        replyIndex += 4;
        api->BxPassiveStrayPosition[j][1] = *(float*)replyIndex;
        replyIndex += 4;
        api->BxPassiveStrayPosition[j][2] = *(float*)replyIndex;
        replyIndex += 4;
      }
    }

    // Get the system status
    api->BxSystemStatus = (char)replyIndex[1] << 8 | (char)replyIndex[0];
    replyIndex += 2;
  }